

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void AddErrorLocationInfo(char *codeStart,char *errorPos,char *errorBuf,uint errorBufSize)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  byte *pbVar5;
  ulong uVar6;
  byte bVar7;
  byte *pbVar8;
  char *pos;
  byte *pbVar9;
  int iVar10;
  char *dst;
  byte *pbVar11;
  
  if (errorBufSize == 0 || errorBuf == (char *)0x0) {
    return;
  }
  sVar3 = strlen(errorBuf);
  dst = errorBuf + sVar3;
  if (codeStart != (char *)0x0 && errorPos != (char *)0x0) {
    sVar4 = strlen(codeStart);
    if (errorPos <= codeStart + sVar4 && codeStart <= errorPos) {
      pbVar8 = (byte *)(errorPos + (codeStart + sVar4 != errorPos));
      pbVar5 = (byte *)errorPos;
      while (pbVar9 = pbVar5, pbVar11 = (byte *)codeStart, codeStart < pbVar9) {
        pbVar11 = pbVar9;
        if ((pbVar9[-1] == 0xd) || (pbVar5 = pbVar9 + -1, pbVar9[-1] == 10)) break;
      }
      while ((0xd < *pbVar8 || ((0x2401U >> (*pbVar8 & 0x1f) & 1) == 0))) {
        pbVar8 = pbVar8 + 1;
      }
      if ((uint)sVar3 < errorBufSize) {
        *dst = '\n';
        dst = dst + 1;
      }
      uVar6 = 1;
      if (codeStart < errorPos) {
        do {
          uVar6 = (ulong)((int)uVar6 + (uint)(*codeStart == '\n'));
          codeStart = codeStart + 1;
        } while (codeStart != errorPos);
      }
      iVar10 = (int)errorBuf;
      iVar1 = NULLC::SafeSprintf(dst,(ulong)((iVar10 - (int)dst) + errorBufSize),"  at line %d: \'",
                                 uVar6);
      pbVar9 = (byte *)(dst + iVar1);
      bVar7 = *pbVar11;
      pbVar5 = pbVar11;
      if (pbVar11 < pbVar8 && bVar7 != 0) {
        do {
          pbVar5 = pbVar5 + 1;
          if ((uint)((int)pbVar9 - iVar10) < errorBufSize) {
            if (bVar7 == 9) {
              bVar7 = 0x20;
            }
            *pbVar9 = bVar7;
            pbVar9 = pbVar9 + 1;
          }
        } while ((pbVar5 < pbVar8) && (bVar7 = *pbVar5, bVar7 != 0));
      }
      iVar2 = NULLC::SafeSprintf((char *)pbVar9,(ulong)((iVar10 - (int)pbVar9) + errorBufSize),
                                 "\'\n");
      pbVar9 = pbVar9 + iVar2;
      for (iVar1 = iVar1 + ((int)errorPos - (int)pbVar11); iVar1 != 0; iVar1 = iVar1 + -1) {
        if ((uint)((int)pbVar9 - iVar10) < errorBufSize) {
          *pbVar9 = 0x20;
          pbVar9 = pbVar9 + 1;
        }
      }
      NULLC::SafeSprintf((char *)pbVar9,(ulong)((iVar10 - (int)pbVar9) + errorBufSize),"^\n");
      errorBuf[errorBufSize - 1] = '\0';
      return;
    }
  }
  NULLC::SafeSprintf(dst,(ulong)(errorBufSize - (uint)sVar3),"\n");
  return;
}

Assistant:

void AddErrorLocationInfo(const char *codeStart, const char *errorPos, char *errorBuf, unsigned errorBufSize)
{
	if(!errorBuf || !errorBufSize)
		return;

	char *errorCurr = errorBuf + strlen(errorBuf);

	if(!codeStart || !errorPos)
	{
		errorCurr += NULLC::SafeSprintf(errorCurr, errorBufSize - unsigned(errorCurr - errorBuf), "\n");
		return;
	}

	const char *codeEnd = codeStart + strlen(codeStart);

	if(errorPos < codeStart || errorPos > codeEnd)
	{
		errorCurr += NULLC::SafeSprintf(errorCurr, errorBufSize - unsigned(errorCurr - errorBuf), "\n");
		return;
	}

	const char *start = errorPos;
	const char *end = start == codeEnd ? start : start + 1;

	while(start > codeStart && *(start - 1) != '\r' && *(start - 1) != '\n')
		start--;

	while(*end && *end != '\r' && *end != '\n')
		end++;

	if(errorBufSize > unsigned(errorCurr - errorBuf))
		*(errorCurr++) = '\n';

	char *errorCurrBefore = errorCurr;

	if(unsigned line = GetErrorLocationLineNumber(codeStart, errorPos))
		errorCurr += NULLC::SafeSprintf(errorCurr, errorBufSize - unsigned(errorCurr - errorBuf), "  at line %d: '", line);
	else
		errorCurr += NULLC::SafeSprintf(errorCurr, errorBufSize - unsigned(errorCurr - errorBuf), "  at '");

	unsigned spacing = unsigned(errorCurr - errorCurrBefore);

	for(const char *pos = start; *pos && pos < end; pos++)
	{
		if(errorBufSize > unsigned(errorCurr - errorBuf))
			*(errorCurr++) = *pos == '\t' ? ' ' : *pos;
	}

	errorCurr += NULLC::SafeSprintf(errorCurr, errorBufSize - unsigned(errorCurr - errorBuf), "'\n");

	for(unsigned i = 0; i < spacing + unsigned(errorPos - start); i++)
	{
		if(errorBufSize > unsigned(errorCurr - errorBuf))
			*(errorCurr++) = ' ';
	}

	errorCurr += NULLC::SafeSprintf(errorCurr, errorBufSize - unsigned(errorCurr - errorBuf), "^\n");

	errorBuf[errorBufSize - 1] = '\0';
}